

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  Descriptor *this_00;
  bool bVar1;
  ClassNameResolver *pCVar2;
  FieldDescriptor *pFVar3;
  reference ppVar4;
  int index;
  int local_64;
  OneofDescriptor *oneof;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_58;
  LogMessageFatal local_40;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_0168e5c0;
  this->context_ = context;
  pCVar2 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar2;
  MakeImmutableFieldLiteGenerators(&this->field_generators_,descriptor,context);
  if ((context->options_).enforce_lite != true) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
               ,0x3b,"!HasDescriptorMethods(descriptor->file(), context->EnforceLite())");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_58,
               (char (*) [89])
               "Generator factory error: A lite message generator is used to generate non-lite messages."
              );
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  index = 0;
  do {
    this_00 = (this->super_MessageGenerator).descriptor_;
    if (this_00->field_count_ <= index) {
      return;
    }
    pFVar3 = Descriptor::field(this_00,index);
    bVar1 = IsRealOneof(pFVar3);
    if (bVar1) {
      pFVar3 = Descriptor::field((this->super_MessageGenerator).descriptor_,index);
      oneof = FieldDescriptor::containing_oneof(pFVar3);
      local_64 = (int)(((long)oneof - (long)oneof->containing_type_->oneof_decls_) / 0x38);
      absl::lts_20250127::container_internal::
      btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
      ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                (&local_58,&(this->super_MessageGenerator).oneofs_,&local_64,&oneof);
      ppVar4 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*(&local_58.first);
      if (ppVar4->second != oneof) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
                   ,0x41,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(MakeImmutableFieldLiteGenerators(descriptor, context)) {
  ABSL_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
}